

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermission.cpp
# Opt level: O3

void __thiscall
DIntermissionScreen::Init(DIntermissionScreen *this,FIntermissionAction *desc,bool first)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  FIntermissionPatch *pFVar3;
  undefined8 uVar4;
  bool bVar5;
  char cVar6;
  uint uVar7;
  FTextureID FVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  char *pcVar12;
  FName *pFVar13;
  undefined4 extraout_var;
  NameEntry *pNVar15;
  FIIntermissionPatch *pFVar16;
  FString musicname;
  long lVar17;
  long lVar18;
  char *pp;
  FMemLump local_48;
  FSoundID local_34;
  uint *puVar14;
  
  if ((desc->mCdTrack == 0) || (bVar5 = S_ChangeCDMusic(desc->mCdTrack,desc->mCdId,true), !bVar5)) {
    musicname.Chars = (desc->mMusic).Chars;
    if (*(int *)(musicname.Chars + -0xc) == 0) {
      musicname.Chars = gameinfo.finaleMusic.Chars;
      iVar9 = gameinfo.finaleOrder;
      if (!first) goto LAB_0030232c;
    }
    else {
      iVar9 = desc->mMusicOrder;
    }
    S_ChangeMusic(musicname.Chars,iVar9,desc->mMusicLooping,false);
  }
LAB_0030232c:
  *(int *)&(this->super_DObject).field_0x24 = desc->mDuration;
  pcVar12 = (desc->mBackground).Chars;
  cVar6 = *pcVar12;
  if (cVar6 == '$') {
    pcVar12 = FStringTable::operator()(&GStrings,pcVar12 + 1);
  }
  else {
    if (cVar6 != '@') goto LAB_003023b5;
    uVar11 = strtoul(pcVar12 + 1,(char **)&local_48,10);
    if ((*(byte *)local_48.Block.Chars == 0) &&
       (uVar7 = (int)uVar11 - 1, uVar7 < gameinfo.finalePages.Count)) {
      pFVar13 = gameinfo.finalePages.Array + uVar7;
LAB_0030239e:
      pNVar15 = FName::NameData.NameArray + pFVar13->Index;
    }
    else {
      pFVar13 = gameinfo.finalePages.Array;
      if (gameinfo.finalePages.Count != 0) goto LAB_0030239e;
      pNVar15 = (NameEntry *)&gameinfo.TitlePage;
    }
    pcVar12 = pNVar15->Text;
  }
  cVar6 = *pcVar12;
LAB_003023b5:
  if (cVar6 != '\0') {
    FVar8 = FTextureManager::CheckForTexture(&TexMan,pcVar12,8,1);
    (this->mBackground).texnum = FVar8.texnum;
    this->mFlatfill = desc->mFlatfill;
  }
  local_34.ID = S_FindSound((desc->mSound).Chars);
  S_Sound(0x22,&stack0xffffffffffffffcc,1.0,0.0);
  pcVar12 = (desc->mPalette).Chars;
  if ((*(int *)(pcVar12 + -0xc) != 0) &&
     (iVar9 = FWadCollection::CheckNumForFullName(&Wads,pcVar12,true,0), 0 < iVar9)) {
    FMemLump::FMemLump(&local_48);
    FWadCollection::ReadLump((FWadCollection *)&stack0xffffffffffffffc0,0x1c70340);
    FMemLump::operator=(&local_48,(FMemLump *)&stack0xffffffffffffffc0);
    FMemLump::~FMemLump((FMemLump *)&stack0xffffffffffffffc0);
    iVar9 = *(int *)((long)local_48.Block.Chars + -0xc);
    iVar10 = (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x1a])();
    puVar14 = (uint *)CONCAT44(extraout_var,iVar10);
    if (iVar9 == 0) {
      local_48.Block.Chars = (FString)(FString)(byte *)0x0;
    }
    uVar7 = 0x101;
    do {
      *puVar14 = (uint)*(byte *)((long)local_48.Block.Chars + 1) << 8 |
                 (uint)*(byte *)local_48.Block.Chars << 0x10 |
                 (uint)*(byte *)((long)local_48.Block.Chars + 2);
      puVar14 = puVar14 + 1;
      local_48.Block.Chars = (FString)((long)local_48.Block.Chars + 3);
      uVar7 = uVar7 - 1;
    } while (1 < uVar7);
    (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x1c])();
    this->mPaletteChanged = true;
    NoWipe = 1;
    M_EnableMenu(false);
    FMemLump::~FMemLump(&local_48);
  }
  TArray<FIIntermissionPatch,_FIIntermissionPatch>::Resize(&this->mOverlays,(desc->mOverlays).Count)
  ;
  if ((this->mOverlays).Count != 0) {
    pFVar16 = (this->mOverlays).Array;
    lVar17 = 0x10;
    lVar18 = 0;
    uVar11 = 0;
    do {
      pFVar3 = (desc->mOverlays).Array;
      puVar1 = (undefined8 *)((long)&(pFVar3->mCondition).Index + lVar17);
      uVar4 = puVar1[1];
      puVar2 = (undefined8 *)((long)&pFVar16->x + lVar18);
      *puVar2 = *puVar1;
      puVar2[1] = uVar4;
      *(undefined4 *)((long)&(pFVar16->mCondition).Index + lVar18) =
           *(undefined4 *)((long)pFVar3 + lVar17 + -0x10);
      FVar8 = FTextureManager::CheckForTexture(&TexMan,*(char **)((long)pFVar3 + lVar17 + -8),8,1);
      pFVar16 = (this->mOverlays).Array;
      *(int *)((long)&(pFVar16->mPic).texnum + lVar18) = FVar8.texnum;
      uVar11 = uVar11 + 1;
      lVar17 = lVar17 + 0x20;
      lVar18 = lVar18 + 0x18;
    } while (uVar11 < (this->mOverlays).Count);
  }
  this->mTicker = 0;
  return;
}

Assistant:

void DIntermissionScreen::Init(FIntermissionAction *desc, bool first)
{
	int lumpnum;

	if (desc->mCdTrack == 0 || !S_ChangeCDMusic (desc->mCdTrack, desc->mCdId))
	{
		if (desc->mMusic.IsEmpty())
		{
			// only start the default music if this is the first action in an intermission
			if (first) S_ChangeMusic (gameinfo.finaleMusic, gameinfo.finaleOrder, desc->mMusicLooping);
		}
		else
		{
			S_ChangeMusic (desc->mMusic, desc->mMusicOrder, desc->mMusicLooping);
		}
	}
	mDuration = desc->mDuration;

	const char *texname = desc->mBackground;
	if (*texname == '@')
	{
		char *pp;
		unsigned int v = strtoul(texname+1, &pp, 10) - 1;
		if (*pp == 0 && v < gameinfo.finalePages.Size())
		{
			texname = gameinfo.finalePages[v].GetChars();
		}
		else if (gameinfo.finalePages.Size() > 0)
		{
			texname = gameinfo.finalePages[0].GetChars();
		}
		else
		{
			texname = gameinfo.TitlePage.GetChars();
		}
	}
	else if (*texname == '$')
	{
		texname = GStrings(texname+1);
	}
	if (texname[0] != 0)
	{
		mBackground = TexMan.CheckForTexture(texname, FTexture::TEX_MiscPatch);
		mFlatfill = desc->mFlatfill;
	}
	S_Sound (CHAN_VOICE | CHAN_UI, desc->mSound, 1.0f, ATTN_NONE);
	if (desc->mPalette.IsNotEmpty() && (lumpnum = Wads.CheckNumForFullName(desc->mPalette, true)) > 0)
	{
		PalEntry *palette;
		const BYTE *orgpal;
		FMemLump lump;
		int i;

		lump = Wads.ReadLump (lumpnum);
		orgpal = (BYTE *)lump.GetMem();
		palette = screen->GetPalette ();
		for (i = 256; i > 0; i--, orgpal += 3)
		{
			*palette++ = PalEntry (orgpal[0], orgpal[1], orgpal[2]);
		}
		screen->UpdatePalette ();
		mPaletteChanged = true;
		NoWipe = 1;
		M_EnableMenu(false);
	}
	mOverlays.Resize(desc->mOverlays.Size());
	for (unsigned i=0; i < mOverlays.Size(); i++)
	{
		mOverlays[i].x = desc->mOverlays[i].x;
		mOverlays[i].y = desc->mOverlays[i].y;
		mOverlays[i].mCondition = desc->mOverlays[i].mCondition;
		mOverlays[i].mPic = TexMan.CheckForTexture(desc->mOverlays[i].mName, FTexture::TEX_MiscPatch);
	}
	mTicker = 0;
}